

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

size_t __thiscall gpu::Context::getCoresEstimate(Context *this)

{
  Type TVar1;
  element_type *this_00;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  Context local_28;
  size_t compute_units;
  Context *this_local;
  
  local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  compute_units = (size_t)this;
  TVar1 = type(this);
  if (TVar1 == TypeOpenCL) {
    cl(&local_28);
    this_00 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_28);
    local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ocl::OpenCLEngine::maxComputeUnits(this_00)
    ;
    std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/context.cpp"
               ,&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"No GPU context!",&local_81);
    raiseException(&local_58,0xab,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return (long)local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi << 8;
}

Assistant:

size_t Context::getCoresEstimate()
{
	size_t compute_units = 1;

	switch (type()) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			cudaDeviceProp deviceProp;
			CUDA_SAFE_CALL(cudaGetDeviceProperties(&deviceProp, data_->cuda_device));
			compute_units = (size_t) deviceProp.multiProcessorCount;
			break;
#endif
		case Context::TypeOpenCL:
			compute_units = cl()->maxComputeUnits();
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	return compute_units * 256;
}